

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O0

asn_dec_rval_t
SET_OF_decode_uper(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,
                  asn_per_constraints_t *constraints,void **sptr,asn_per_data_t *pd)

{
  int iVar1;
  int32_t iVar2;
  undefined4 uVar3;
  undefined8 *in_RCX;
  long in_RDX;
  size_t extraout_RDX;
  asn_per_data_t *in_RSI;
  undefined8 in_RDI;
  int *in_R8;
  asn_dec_rval_t aVar4;
  void *ptr;
  int i;
  int value;
  ssize_t nelems;
  int repeat;
  asn_per_constraint_t *ct;
  asn_anonymous_set_ *list;
  void *st;
  asn_TYPE_member_t *elm;
  asn_SET_OF_specifics_t *specs;
  asn_dec_rval_t rv;
  asn_dec_rval_t tmp_error;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  uint uVar5;
  void *in_stack_ffffffffffffff50;
  asn_per_data_t *in_stack_ffffffffffffff58;
  uint8_t *puVar6;
  undefined4 uStack_9c;
  long local_90;
  int local_88;
  int32_t local_84;
  ulong local_80;
  int local_74;
  code *local_70;
  void *local_68;
  void *local_60;
  void *local_58;
  int *local_50;
  ulong local_48;
  size_t local_40;
  int *local_38;
  undefined8 *local_30;
  ulong local_10;
  size_t local_8;
  
  local_50 = (int *)in_RSI[3].nboff;
  local_58 = in_RSI[2].refill_key;
  local_60 = (void *)*in_RCX;
  local_74 = 0;
  local_38 = in_R8;
  local_30 = in_RCX;
  iVar1 = ASN__STACK_OVERFLOW_CHECK
                    ((asn_codec_ctx_t *)
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (iVar1 == 0) {
    if (local_60 == (void *)0x0) {
      local_60 = calloc(1,(long)*local_50);
      *local_30 = local_60;
      if (local_60 == (void *)0x0) {
        local_10 = 2;
        local_8 = 0;
        if (in_RSI == (asn_per_data_t *)0x0) {
          puVar6 = "";
        }
        else {
          puVar6 = in_RSI->buffer;
        }
        ASN_DEBUG("Failed to decode element %s",puVar6);
        goto LAB_0016162e;
      }
    }
    local_68 = local_60;
    if (in_RDX == 0) {
      if (in_RSI[2].refill == (_func_int_asn_per_data_s_ptr *)0x0) {
        local_70 = (code *)0x0;
      }
      else {
        local_70 = in_RSI[2].refill + 0x20;
      }
    }
    else {
      local_70 = (code *)(in_RDX + 0x20);
    }
    if ((local_70 != (code *)0x0) && ((*(uint *)local_70 & 4) != 0)) {
      local_84 = per_get_few_bits(in_RSI,(int)((ulong)in_RDX >> 0x20));
      if (local_84 < 0) {
        local_10 = 1;
        local_8 = 0;
        goto LAB_0016162e;
      }
      if (local_84 != 0) {
        local_70 = (code *)0x0;
      }
    }
    if ((local_70 == (code *)0x0) || ((int)*(uint *)(local_70 + 8) < 0)) {
      local_80 = 0xffffffffffffffff;
    }
    else {
      iVar2 = per_get_few_bits(in_RSI,(int)((ulong)in_RDX >> 0x20));
      local_80 = (ulong)iVar2;
      ASN_DEBUG("Preparing to fetch %ld+%ld elements from %s",local_80,
                *(undefined8 *)(local_70 + 0x10),in_RSI->buffer);
      if ((long)local_80 < 0) {
        local_10 = 1;
        local_8 = 0;
        goto LAB_0016162e;
      }
      local_80 = *(long *)(local_70 + 0x10) + local_80;
    }
    do {
      if ((long)local_80 < 0) {
        local_80 = uper_get_length(in_stack_ffffffffffffff58,
                                   (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),local_38);
        if (local_70 == (code *)0x0) {
          uVar5 = 0xffffffff;
        }
        else {
          uVar5 = *(uint *)(local_70 + 8);
        }
        ASN_DEBUG("Got to decode %d elements (eff %d)",local_80 & 0xffffffff,(ulong)uVar5);
        if ((long)local_80 < 0) {
          local_10 = 1;
          local_8 = 0;
          goto LAB_0016162e;
        }
      }
      for (local_88 = 0; (long)local_88 < (long)local_80; local_88 = local_88 + 1) {
        local_90 = 0;
        ASN_DEBUG("SET OF %s decoding",**(undefined8 **)((long)local_58 + 0x18));
        uVar3 = (**(code **)(*(long *)((long)local_58 + 0x18) + 0x48))
                          (in_RDI,*(undefined8 *)((long)local_58 + 0x18),
                           *(undefined8 *)((long)local_58 + 0x28),&local_90,local_38);
        local_48 = CONCAT44(uStack_9c,uVar3);
        local_40 = extraout_RDX;
        ASN_DEBUG("%s SET OF %s decoded %d, %p",in_RSI->buffer,
                  **(undefined8 **)((long)local_58 + 0x18),uVar3,local_90);
        if ((int)local_48 != 0) {
          ASN_DEBUG("Failed decoding %s of %s (SET OF)",**(undefined8 **)((long)local_58 + 0x18),
                    in_RSI->buffer);
LAB_00161571:
          if (local_90 != 0) {
            (**(code **)(*(long *)((long)local_58 + 0x18) + 0x10))
                      (*(undefined8 *)((long)local_58 + 0x18),local_90,0);
          }
          local_10 = local_48;
          local_8 = local_40;
          goto LAB_0016162e;
        }
        iVar1 = asn_set_add(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
        if (iVar1 != 0) {
          ASN_DEBUG("Failed to add element into %s",in_RSI->buffer);
          local_48 = CONCAT44(local_48._4_4_,2);
          goto LAB_00161571;
        }
      }
      local_80 = 0xffffffffffffffff;
    } while (local_74 != 0);
    ASN_DEBUG("Decoded %s as SET OF",in_RSI->buffer);
    local_10 = 0;
    local_8 = 0;
  }
  else {
    local_10 = 2;
    local_8 = 0;
    if (in_RSI == (asn_per_data_t *)0x0) {
      puVar6 = "";
    }
    else {
      puVar6 = in_RSI->buffer;
    }
    ASN_DEBUG("Failed to decode element %s",puVar6);
  }
LAB_0016162e:
  aVar4._0_8_ = local_10 & 0xffffffff;
  aVar4.consumed = local_8;
  return aVar4;
}

Assistant:

asn_dec_rval_t
SET_OF_decode_uper(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
        asn_per_constraints_t *constraints, void **sptr, asn_per_data_t *pd) {
	asn_dec_rval_t rv;
        asn_SET_OF_specifics_t *specs = (asn_SET_OF_specifics_t *)td->specifics;
	asn_TYPE_member_t *elm = td->elements;	/* Single one */
	void *st = *sptr;
	asn_anonymous_set_ *list;
	asn_per_constraint_t *ct;
	int repeat = 0;
	ssize_t nelems;

	if(ASN__STACK_OVERFLOW_CHECK(opt_codec_ctx))
		ASN__DECODE_FAILED;

	/*
	 * Create the target structure if it is not present already.
	 */
	if(!st) {
		st = *sptr = CALLOC(1, specs->struct_size);
		if(!st) ASN__DECODE_FAILED;
	}                                                                       
	list = _A_SET_FROM_VOID(st);

	/* Figure out which constraints to use */
	if(constraints) ct = &constraints->size;
	else if(td->per_constraints) ct = &td->per_constraints->size;
	else ct = 0;

	if(ct && ct->flags & APC_EXTENSIBLE) {
		int value = per_get_few_bits(pd, 1);
		if(value < 0) ASN__DECODE_STARVED;
		if(value) ct = 0;	/* Not restricted! */
	}

	if(ct && ct->effective_bits >= 0) {
		/* X.691, #19.5: No length determinant */
		nelems = per_get_few_bits(pd, ct->effective_bits);
		ASN_DEBUG("Preparing to fetch %ld+%ld elements from %s",
			(long)nelems, ct->lower_bound, td->name);
		if(nelems < 0)  ASN__DECODE_STARVED;
		nelems += ct->lower_bound;
	} else {
		nelems = -1;
	}

	do {
		int i;
		if(nelems < 0) {
			nelems = uper_get_length(pd,
				ct ? ct->effective_bits : -1, &repeat);
			ASN_DEBUG("Got to decode %d elements (eff %d)",
				(int)nelems, (int)(ct ? ct->effective_bits : -1));
			if(nelems < 0) ASN__DECODE_STARVED;
		}

		for(i = 0; i < nelems; i++) {
			void *ptr = 0;
			ASN_DEBUG("SET OF %s decoding", elm->type->name);
			rv = elm->type->uper_decoder(opt_codec_ctx, elm->type,
				elm->per_constraints, &ptr, pd);
			ASN_DEBUG("%s SET OF %s decoded %d, %p",
				td->name, elm->type->name, rv.code, ptr);
			if(rv.code == RC_OK) {
				if(ASN_SET_ADD(list, ptr) == 0)
					continue;
				ASN_DEBUG("Failed to add element into %s",
					td->name);
				/* Fall through */
				rv.code = RC_FAIL;
			} else {
				ASN_DEBUG("Failed decoding %s of %s (SET OF)",
					elm->type->name, td->name);
			}
			if(ptr) ASN_STRUCT_FREE(*elm->type, ptr);
			return rv;
		}

		nelems = -1;	/* Allow uper_get_length() */
	} while(repeat);

	ASN_DEBUG("Decoded %s as SET OF", td->name);

	rv.code = RC_OK;
	rv.consumed = 0;
	return rv;
}